

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O0

void __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::set_charclass_posinfo
          (re_compiler<char,_srell::u8regex_traits<char>_> *this)

{
  state_type *psVar1;
  reference prVar2;
  range_pair *prVar3;
  range_pair *posinfo;
  state_type *state;
  size_type i;
  re_compiler<char,_srell::u8regex_traits<char>_> *this_local;
  
  re_character_class::finalise
            (&(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).character_class);
  state = (state_type *)0x1;
  while( true ) {
    psVar1 = (state_type *)
             simple_array<srell::regex_internal::re_state>::size
                       ((simple_array<srell::regex_internal::re_state> *)this);
    if (psVar1 <= state) break;
    prVar2 = simple_array<srell::regex_internal::re_state>::operator[]
                       ((simple_array<srell::regex_internal::re_state> *)this,(size_type)state);
    if (prVar2->type == st_character_class) {
      prVar3 = re_character_class::charclasspos
                         (&(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).
                           character_class,(prVar2->field_0).number);
      re_quantifier::setccpos(&prVar2->quantifier,prVar3->first,prVar3->second);
    }
    state = (state_type *)((long)&state->field_0 + 1);
  }
  return;
}

Assistant:

void set_charclass_posinfo()
	{
		this->character_class.finalise();
		for (typename state_array::size_type i = 1; i < this->NFA_states.size(); ++i)
		{
			state_type &state = this->NFA_states[i];

			if (state.type == st_character_class)
			{
				const range_pair &posinfo = this->character_class.charclasspos(state.number);
				state.quantifier.setccpos(posinfo.first, posinfo.second);
			}
		}
	}